

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

hugeint_t duckdb::DecimalScaleDownOperator::Operation<long,duckdb::hugeint_t>
                    (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  long lVar1;
  DecimalScaleInput<long,_long> *data;
  hugeint_t hVar2;
  
  lVar1 = input / (*(long *)((long)dataptr + 0x28) / 2);
  hVar2 = Cast::Operation<long,duckdb::hugeint_t>((long)(lVar1 + (lVar1 >> 0x3f | 1U)) / 2);
  return hVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		//	We need to round here, not truncate.
		auto data = (DecimalScaleInput<INPUT_TYPE> *)dataptr;
		//	Scale first so we don't overflow when rounding.
		const auto scaling = data->factor / 2;
		input /= scaling;
		if (input < 0) {
			input -= 1;
		} else {
			input += 1;
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input / 2);
	}